

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::TimeZoneNamesImpl::getExemplarLocationName
          (TimeZoneNamesImpl *this,UnicodeString *tzID,UnicodeString *name)

{
  UErrorCode UVar1;
  ZNames *pZVar2;
  UErrorCode status;
  UErrorCode local_3c;
  ConstChar16Ptr local_38 [3];
  
  UnicodeString::setToBogus(name);
  umtx_lock_63((UMutex *)gDataMutex);
  local_3c = U_ZERO_ERROR;
  pZVar2 = loadTimeZoneNames(this,tzID,&local_3c);
  UVar1 = local_3c;
  umtx_unlock_63((UMutex *)gDataMutex);
  if (((pZVar2 != (ZNames *)0x0) && (UVar1 < U_ILLEGAL_ARGUMENT_ERROR)) &&
     (local_38[0].p_ = pZVar2->fNames[0], local_38[0].p_ != (UChar *)0x0)) {
    UnicodeString::setTo(name,'\x01',local_38,-1);
  }
  return name;
}

Assistant:

UnicodeString&
TimeZoneNamesImpl::getExemplarLocationName(const UnicodeString& tzID, UnicodeString& name) const {
    name.setToBogus();  // cleanup result.
    const UChar* locName = NULL;
    ZNames *tznames = NULL;
    TimeZoneNamesImpl *nonConstThis = const_cast<TimeZoneNamesImpl *>(this);

    {
        Mutex lock(&gDataMutex);
        UErrorCode status = U_ZERO_ERROR;
        tznames = nonConstThis->loadTimeZoneNames(tzID, status);
        if (U_FAILURE(status)) { return name; }
    }

    if (tznames != NULL) {
        locName = tznames->getName(UTZNM_EXEMPLAR_LOCATION);
    }
    if (locName != NULL) {
        name.setTo(TRUE, locName, -1);
    }

    return name;
}